

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<std::pair<basisu::vec<6U,_float>,_unsigned_long>_>::push_back
          (vector<std::pair<basisu::vec<6U,_float>,_unsigned_long>_> *this,
          pair<basisu::vec<6U,_float>,_unsigned_long> *obj)

{
  pair<basisu::vec<6U,_float>,_unsigned_long> *in_RSI;
  pair<basisu::vec<6U,_float>,_unsigned_long> *in_RDI;
  bool bVar1;
  undefined2 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffda;
  undefined1 in_stack_ffffffffffffffdb;
  uint32_t in_stack_ffffffffffffffdc;
  
  bVar1 = true;
  if ((*(pair<basisu::vec<6U,_float>,_unsigned_long> **)(in_RDI->first).m_v !=
       (pair<basisu::vec<6U,_float>,_unsigned_long> *)0x0) &&
     (bVar1 = true, *(pair<basisu::vec<6U,_float>,_unsigned_long> **)(in_RDI->first).m_v <= in_RSI))
  {
    bVar1 = *(pair<basisu::vec<6U,_float>,_unsigned_long> **)(in_RDI->first).m_v +
            *(uint32_t *)((long)(in_RDI->first).m_v + 8) <= in_RSI;
  }
  if (!bVar1) {
    __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x267,
                  "void basisu::vector<std::pair<basisu::vec<6, float>, unsigned long>>::push_back(const T &) [T = std::pair<basisu::vec<6, float>, unsigned long>]"
                 );
  }
  if (*(uint32_t *)((long)(in_RDI->first).m_v + 0xc) <= *(uint32_t *)((long)(in_RDI->first).m_v + 8)
     ) {
    increase_capacity((vector<std::pair<basisu::vec<6U,_float>,_unsigned_long>_> *)in_RDI,
                      in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb,
                      (bool)in_stack_ffffffffffffffda);
  }
  scalar_type<std::pair<basisu::vec<6U,_float>,_unsigned_long>_>::construct
            (in_RDI,(pair<basisu::vec<6U,_float>,_unsigned_long> *)
                    CONCAT44(in_stack_ffffffffffffffdc,
                             CONCAT13(in_stack_ffffffffffffffdb,
                                      CONCAT12(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8))
                            ));
  (in_RDI->first).m_v[2] = (float)((int)(in_RDI->first).m_v[2] + 1);
  return;
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }